

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpace.cpp
# Opt level: O0

void __thiscall mnf::RealSpace::RealSpace(RealSpace *this,Index n,double magnitude)

{
  string *this_00;
  ConstRefVec local_e8;
  ConstRefVec local_c0;
  ConstantReturnType local_98;
  undefined1 local_80 [8];
  VectorXd temp;
  string local_50 [48];
  double local_20;
  double magnitude_local;
  Index n_local;
  RealSpace *this_local;
  
  local_20 = magnitude;
  magnitude_local = (double)n;
  n_local = (Index)this;
  Manifold::Manifold(&this->super_Manifold,n,n,n);
  (this->super_Manifold)._vptr_Manifold = (_func_int **)&PTR__RealSpace_0038e9a0;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->typicalMagnitude_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->trustMagnitude_);
  std::__cxx11::to_string
            ((__cxx11 *)
             &temp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (long)magnitude_local);
  std::operator+((char *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"R");
  this_00 = Manifold::name_abi_cxx11_(&this->super_Manifold);
  std::__cxx11::string::operator=((string *)this_00,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string
            ((string *)
             &temp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->typicalMagnitude_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(Index)magnitude_local)
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->trustMagnitude_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             ,(Index)magnitude_local);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Constant
            (&local_98,(Index)magnitude_local,&local_20);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_80,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_98);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_c0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80,(type *)0x0);
  setTypicalMagnitude(this,&local_c0);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_c0);
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_e8,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80,(type *)0x0);
  setTrustMagnitude(this,&local_e8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_e8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_80);
  return;
}

Assistant:

RealSpace::RealSpace(Index n, double magnitude) : Manifold(n, n, n)
{
  name() = "R" + std::to_string(n);
  typicalMagnitude_.resize(n);
  trustMagnitude_.resize(n);
  Eigen::VectorXd temp = Eigen::VectorXd::Constant(n, magnitude);
  setTypicalMagnitude(temp);
  setTrustMagnitude(temp);
}